

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# a_hereticweaps.cpp
# Opt level: O0

int AF_A_InitPhoenixPL2(VMFrameStack *stack,VMValue *param,int numparam,VMReturn *ret,int numret)

{
  DObject *this;
  DObject *this_00;
  long lVar1;
  bool bVar2;
  bool local_56;
  bool local_53;
  APhoenixRod *flamethrower;
  FStateParamInfo *stateinfo;
  AActor *stateowner;
  AActor *self;
  int paramnum;
  int numret_local;
  VMReturn *ret_local;
  int numparam_local;
  VMValue *param_local;
  VMFrameStack *stack_local;
  
  if (numparam < 1) {
    __assert_fail("(paramnum) < numparam",
                  "/workspace/llm4binary/github/license_c_cmakelists/alexey-lysiuk[P]gzdoom/src/g_heretic/a_hereticweaps.cpp"
                  ,0x4f7,"int AF_A_InitPhoenixPL2(VMFrameStack *, VMValue *, int, VMReturn *, int)")
    ;
  }
  bVar2 = false;
  if (((param->field_0).field_3.Type == '\x03') &&
     (bVar2 = true, (param->field_0).field_1.atag != 1)) {
    bVar2 = (param->field_0).field_1.a == (void *)0x0;
  }
  if (!bVar2) {
    __assert_fail("param[paramnum].Type == REGT_POINTER && (param[paramnum].atag == ATAG_OBJECT || param[paramnum].a == NULL)"
                  ,
                  "/workspace/llm4binary/github/license_c_cmakelists/alexey-lysiuk[P]gzdoom/src/g_heretic/a_hereticweaps.cpp"
                  ,0x4f7,"int AF_A_InitPhoenixPL2(VMFrameStack *, VMValue *, int, VMReturn *, int)")
    ;
  }
  this = (DObject *)(param->field_0).field_1.a;
  local_53 = true;
  if (this != (DObject *)0x0) {
    local_53 = DObject::IsKindOf(this,AActor::RegistrationInfo.MyClass);
  }
  if (local_53 == false) {
    __assert_fail("self == NULL || self->IsKindOf(RUNTIME_CLASS(AActor))",
                  "/workspace/llm4binary/github/license_c_cmakelists/alexey-lysiuk[P]gzdoom/src/g_heretic/a_hereticweaps.cpp"
                  ,0x4f7,"int AF_A_InitPhoenixPL2(VMFrameStack *, VMValue *, int, VMReturn *, int)")
    ;
  }
  if ((1 < numparam) && (param[1].field_0.field_3.Type != 0xff)) {
    bVar2 = false;
    if ((param[1].field_0.field_3.Type == '\x03') &&
       (bVar2 = true, param[1].field_0.field_1.atag != 1)) {
      bVar2 = param[1].field_0.field_1.a == (void *)0x0;
    }
    if (!bVar2) {
      __assert_fail("param[paramnum].Type == REGT_POINTER && (param[paramnum].atag == ATAG_OBJECT || param[paramnum].a == NULL)"
                    ,
                    "/workspace/llm4binary/github/license_c_cmakelists/alexey-lysiuk[P]gzdoom/src/g_heretic/a_hereticweaps.cpp"
                    ,0x4f7,
                    "int AF_A_InitPhoenixPL2(VMFrameStack *, VMValue *, int, VMReturn *, int)");
    }
    this_00 = (DObject *)param[1].field_0.field_1.a;
    local_56 = true;
    if (this_00 != (DObject *)0x0) {
      local_56 = DObject::IsKindOf(this_00,AActor::RegistrationInfo.MyClass);
    }
    if (local_56 == false) {
      __assert_fail("stateowner == NULL || stateowner->IsKindOf(RUNTIME_CLASS(AActor))",
                    "/workspace/llm4binary/github/license_c_cmakelists/alexey-lysiuk[P]gzdoom/src/g_heretic/a_hereticweaps.cpp"
                    ,0x4f7,
                    "int AF_A_InitPhoenixPL2(VMFrameStack *, VMValue *, int, VMReturn *, int)");
    }
  }
  if ((2 < numparam) && (param[2].field_0.field_3.Type != 0xff)) {
    bVar2 = false;
    if ((param[2].field_0.field_3.Type == '\x03') &&
       (bVar2 = true, param[2].field_0.field_1.atag != 8)) {
      bVar2 = param[2].field_0.field_1.a == (void *)0x0;
    }
    if (!bVar2) {
      __assert_fail("param[paramnum].Type == REGT_POINTER && (param[paramnum].atag == ATAG_STATEINFO || param[paramnum].a == NULL)"
                    ,
                    "/workspace/llm4binary/github/license_c_cmakelists/alexey-lysiuk[P]gzdoom/src/g_heretic/a_hereticweaps.cpp"
                    ,0x4f7,
                    "int AF_A_InitPhoenixPL2(VMFrameStack *, VMValue *, int, VMReturn *, int)");
    }
  }
  if ((*(long *)&this[0xc].ObjectFlags != 0) &&
     (lVar1 = *(long *)(*(long *)&this[0xc].ObjectFlags + 0xd0), lVar1 != 0)) {
    *(undefined4 *)(lVar1 + 0x584) = 0x15e;
  }
  return 0;
}

Assistant:

DEFINE_ACTION_FUNCTION(AActor, A_InitPhoenixPL2)
{
	PARAM_ACTION_PROLOGUE;

	if (self->player != NULL)
	{
		APhoenixRod *flamethrower = static_cast<APhoenixRod *> (self->player->ReadyWeapon);
		if (flamethrower != NULL)
		{
			flamethrower->FlameCount = FLAME_THROWER_TICS;
		}
	}
	return 0;
}